

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

int connection_encode_frame
              (ENDPOINT_HANDLE endpoint,AMQP_VALUE performative,PAYLOAD *payloads,
              size_t payload_count,ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  CONNECTION_HANDLE callback_context_00;
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_FRAME_CODEC_HANDLE amqp_frame_codec;
  CONNECTION_HANDLE connection;
  LOGGER_LOG l;
  int result;
  void *callback_context_local;
  ON_SEND_COMPLETE on_send_complete_local;
  size_t payload_count_local;
  PAYLOAD *payloads_local;
  AMQP_VALUE performative_local;
  ENDPOINT_HANDLE endpoint_local;
  
  if ((endpoint == (ENDPOINT_HANDLE)0x0) || (performative == (AMQP_VALUE)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"connection_encode_frame",0x80e,1,"Bad arguments: endpoint = %p, performative = %p"
                ,endpoint,performative);
    }
    l._4_4_ = 0x80f;
  }
  else {
    callback_context_00 = endpoint->connection;
    if (callback_context_00->connection_state == CONNECTION_STATE_OPENED) {
      callback_context_00->on_send_complete = on_send_complete;
      callback_context_00->on_send_complete_callback_context = callback_context;
      iVar1 = amqp_frame_codec_encode_frame
                        (callback_context_00->amqp_frame_codec,endpoint->outgoing_channel,
                         performative,payloads,payload_count,on_bytes_encoded,callback_context_00);
      if (iVar1 == 0) {
        if (((byte)callback_context_00->field_0xe0 >> 3 & 1) == 1) {
          log_outgoing_frame(performative);
        }
        iVar1 = tickcounter_get_current_ms
                          (callback_context_00->tick_counter,
                           &callback_context_00->last_frame_sent_time);
        if (iVar1 == 0) {
          l._4_4_ = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                      ,"connection_encode_frame",0x833,1,"Getting tick counter value failed");
          }
          l._4_4_ = 0x834;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                    ,"connection_encode_frame",0x827,1,"Encoding AMQP frame failed");
        }
        l._4_4_ = 0x828;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                  ,"connection_encode_frame",0x819,1,"Connection not open");
      }
      l._4_4_ = 0x81a;
    }
  }
  return l._4_4_;
}

Assistant:

int connection_encode_frame(ENDPOINT_HANDLE endpoint, AMQP_VALUE performative, PAYLOAD* payloads, size_t payload_count, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    /* Codes_S_R_S_CONNECTION_01_249: [If endpoint or performative are NULL, connection_encode_frame shall fail and return a non-zero value.] */
    if ((endpoint == NULL) ||
        (performative == NULL))
    {
        LogError("Bad arguments: endpoint = %p, performative = %p",
            endpoint, performative);
        result = MU_FAILURE;
    }
    else
    {
        CONNECTION_HANDLE connection = (CONNECTION_HANDLE)endpoint->connection;
        AMQP_FRAME_CODEC_HANDLE amqp_frame_codec = connection->amqp_frame_codec;

        /* Codes_S_R_S_CONNECTION_01_254: [If connection_encode_frame is called before the connection is in the OPENED state, connection_encode_frame shall fail and return a non-zero value.] */
        if (connection->connection_state != CONNECTION_STATE_OPENED)
        {
            LogError("Connection not open");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_S_R_S_CONNECTION_01_255: [The payload size shall be computed based on all the payload chunks passed as argument in payloads.] */
            /* Codes_S_R_S_CONNECTION_01_250: [connection_encode_frame shall initiate the frame send by calling amqp_frame_codec_begin_encode_frame.] */
            /* Codes_S_R_S_CONNECTION_01_251: [The channel number passed to amqp_frame_codec_begin_encode_frame shall be the outgoing channel number associated with the endpoint by connection_create_endpoint.] */
            /* Codes_S_R_S_CONNECTION_01_252: [The performative passed to amqp_frame_codec_begin_encode_frame shall be the performative argument of connection_encode_frame.] */
            connection->on_send_complete = on_send_complete;
            connection->on_send_complete_callback_context = callback_context;
            if (amqp_frame_codec_encode_frame(amqp_frame_codec, endpoint->outgoing_channel, performative, payloads, payload_count, on_bytes_encoded, connection) != 0)
            {
                /* Codes_S_R_S_CONNECTION_01_253: [If amqp_frame_codec_begin_encode_frame or amqp_frame_codec_encode_payload_bytes fails, then connection_encode_frame shall fail and return a non-zero value.] */
                LogError("Encoding AMQP frame failed");
                result = MU_FAILURE;
            }
            else
            {
                if (connection->is_trace_on == 1)
                {
                    log_outgoing_frame(performative);
                }

                if (tickcounter_get_current_ms(connection->tick_counter, &connection->last_frame_sent_time) != 0)
                {
                    LogError("Getting tick counter value failed");
                    result = MU_FAILURE;
                }
                else
                {
                    /* Codes_S_R_S_CONNECTION_01_248: [On success it shall return 0.] */
                    result = 0;
                }
            }
        }
    }

    return result;
}